

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O0

int __thiscall luna::Lexer::LexMultiLineString(Lexer *this,TokenDetail *detail)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  int iVar8;
  undefined8 uVar9;
  String *pSVar10;
  LexException *in_RSI;
  char *in_RDI;
  LexException *unaff_retaddr;
  char (*in_stack_00000010) [2];
  int i;
  int equals;
  Lexer *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  State *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar11;
  char *module;
  
  iVar11 = 0;
  module = in_RDI;
  while (*(int *)(in_RDI + 0x30) == 0x3d) {
    iVar11 = iVar11 + 1;
    iVar8 = Next(in_stack_ffffffffffffffb0);
    *(int *)(in_RDI + 0x30) = iVar8;
  }
  if (*(int *)(in_RDI + 0x30) == 0x5b) {
    iVar8 = Next(in_stack_ffffffffffffffb0);
    *(int *)(in_RDI + 0x30) = iVar8;
    std::__cxx11::string::clear();
    cVar1 = (char)in_RDI;
    if (((*(int *)(in_RDI + 0x30) == 0xd) || (*(int *)(in_RDI + 0x30) == 10)) &&
       (LexNewLine(in_stack_ffffffffffffffb0), iVar11 == 0)) {
      std::__cxx11::string::push_back(cVar1 + '@');
    }
    while( true ) {
      while( true ) {
        if (*(int *)(in_RDI + 0x30) == -1) {
          uVar9 = __cxa_allocate_exception(0x20);
          String::GetCStr(*(String **)(in_RDI + 8));
          LexException::LexException<char_const(&)[38]>
                    (in_RSI,(char *)CONCAT44(iVar11,in_stack_ffffffffffffffe8),
                     in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0,
                     (char (*) [38])CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
          __cxa_throw(uVar9,&LexException::typeinfo,LexException::~LexException);
        }
        if (*(int *)(in_RDI + 0x30) == 0x5d) break;
        if ((*(int *)(in_RDI + 0x30) == 0xd) || (*(int *)(in_RDI + 0x30) == 10)) {
          LexNewLine(in_stack_ffffffffffffffb0);
          std::__cxx11::string::push_back(cVar1 + '@');
        }
        else {
          std::__cxx11::string::push_back(cVar1 + '@');
          iVar8 = Next(in_stack_ffffffffffffffb0);
          *(int *)(in_RDI + 0x30) = iVar8;
        }
      }
      iVar8 = Next(in_stack_ffffffffffffffb0);
      *(int *)(in_RDI + 0x30) = iVar8;
      in_stack_ffffffffffffffd8 = 0;
      while ((in_stack_ffffffffffffffd8 < iVar11 && (*(int *)(in_RDI + 0x30) == 0x3d))) {
        in_stack_ffffffffffffffd8 = in_stack_ffffffffffffffd8 + 1;
        iVar8 = Next(in_stack_ffffffffffffffb0);
        *(int *)(in_RDI + 0x30) = iVar8;
      }
      if ((in_stack_ffffffffffffffd8 == iVar11) && (*(int *)(in_RDI + 0x30) == 0x5d)) break;
      std::__cxx11::string::push_back(cVar1 + '@');
      std::__cxx11::string::append((ulong)(in_RDI + 0x40),(char)in_stack_ffffffffffffffd8);
    }
    iVar11 = Next(in_stack_ffffffffffffffb0);
    *(int *)(in_RDI + 0x30) = iVar11;
    pSVar10 = State::GetString(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    *(String **)&in_RSI->super_Exception = pSVar10;
    *(undefined4 *)&(in_RSI->super_Exception).field_0x18 = 0x116;
    cVar1 = in_RDI[0x35];
    cVar2 = in_RDI[0x36];
    cVar3 = in_RDI[0x37];
    (in_RSI->super_Exception).field_0x10 = in_RDI[0x34];
    (in_RSI->super_Exception).field_0x11 = cVar1;
    (in_RSI->super_Exception).field_0x12 = cVar2;
    (in_RSI->super_Exception).field_0x13 = cVar3;
    cVar1 = in_RDI[0x39];
    cVar2 = in_RDI[0x3a];
    cVar3 = in_RDI[0x3b];
    (in_RSI->super_Exception).field_0x14 = in_RDI[0x38];
    (in_RSI->super_Exception).field_0x15 = cVar1;
    (in_RSI->super_Exception).field_0x16 = cVar2;
    (in_RSI->super_Exception).field_0x17 = cVar3;
    cVar1 = in_RDI[9];
    cVar2 = in_RDI[10];
    cVar3 = in_RDI[0xb];
    cVar4 = in_RDI[0xc];
    cVar5 = in_RDI[0xd];
    cVar6 = in_RDI[0xe];
    cVar7 = in_RDI[0xf];
    (in_RSI->super_Exception).field_0x8 = in_RDI[8];
    (in_RSI->super_Exception).field_0x9 = cVar1;
    (in_RSI->super_Exception).field_0xa = cVar2;
    (in_RSI->super_Exception).field_0xb = cVar3;
    (in_RSI->super_Exception).field_0xc = cVar4;
    (in_RSI->super_Exception).field_0xd = cVar5;
    (in_RSI->super_Exception).field_0xe = cVar6;
    (in_RSI->super_Exception).field_0xf = cVar7;
    return 0x116;
  }
  uVar9 = __cxa_allocate_exception(0x20);
  String::GetCStr(*(String **)(in_RDI + 8));
  LexException::LexException<char_const(&)[34],std::__cxx11::string&,char_const(&)[2]>
            (unaff_retaddr,module,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,
             (char (*) [34])CONCAT44(iVar11,in_stack_ffffffffffffffe8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_stack_00000010);
  __cxa_throw(uVar9,&LexException::typeinfo,LexException::~LexException);
}

Assistant:

int Lexer::LexMultiLineString(TokenDetail *detail)
    {
        int equals = 0;
        while (current_ == '=')
        {
            ++equals;
            current_ = Next();
        }

        if (current_ != '[')
            throw LexException(module_->GetCStr(), line_, column_,
                    "incomplete multi-line string at '", token_buffer_, "'");

        current_ = Next();
        token_buffer_.clear();

        if (current_ == '\r' || current_ == '\n')
        {
            LexNewLine();
            if (equals == 0)    // "[[]]" keeps first '\n'
                token_buffer_.push_back('\n');
        }

        while (current_ != EOF)
        {
            if (current_ == ']')
            {
                current_ = Next();
                int i = 0;
                for (; i < equals; ++i, current_ = Next())
                {
                    if (current_ != '=')
                        break;
                }

                if (i == equals && current_ == ']')
                {
                    current_ = Next();
                    RETURN_TOKEN_DETAIL(detail, token_buffer_, Token_String);
                }
                else
                {
                    token_buffer_.push_back(']');
                    token_buffer_.append(i, '=');
                }
            }
            else if (current_ == '\r' || current_ == '\n')
            {
                LexNewLine();
                token_buffer_.push_back('\n');
            }
            else
            {
                token_buffer_.push_back(current_);
                current_ = Next();
            }
        }

        throw LexException(module_->GetCStr(), line_, column_,
                "incomplete multi-line string at <eof>");
    }